

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_types.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::TestVectorTypesBind
          (duckdb *this,ClientContext *context,TableFunctionBindInput *input,
          vector<duckdb::LogicalType,_true> *return_types,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names)

{
  bool bVar1;
  reference __x;
  pointer pTVar2;
  InternalException *this_00;
  pointer *__ptr;
  ulong __n;
  __node_base *p_Var3;
  _Head_base<0UL,_duckdb::TestVectorBindData_*,_false> local_88;
  __uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> local_80;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_78;
  string name;
  string local_50;
  
  local_80._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
  super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
       (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
       (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)this;
  local_78 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names;
  make_uniq<duckdb::TestVectorBindData>();
  for (__n = 0; __n < (ulong)((long)(input->inputs->
                                    super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                                    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(input->inputs->
                                    super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                                    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 6); __n = __n + 1)
  {
    ::std::__cxx11::string::string((string *)&name,"test_vector",(allocator *)&local_50);
    if (__n != 0) {
      ::std::__cxx11::to_string(&local_50,__n + 1);
      ::std::__cxx11::string::append((string *)&name);
      ::std::__cxx11::string::~string((string *)&local_50);
    }
    __x = vector<duckdb::Value,_true>::get<true>(input->inputs,__n);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>(local_78,&name);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
              (&return_types->
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,&__x->type_)
    ;
    pTVar2 = unique_ptr<duckdb::TestVectorBindData,_std::default_delete<duckdb::TestVectorBindData>,_true>
             ::operator->((unique_ptr<duckdb::TestVectorBindData,_std::default_delete<duckdb::TestVectorBindData>,_true>
                           *)&local_88);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
              (&(pTVar2->types).
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,&__x->type_)
    ;
    ::std::__cxx11::string::~string((string *)&name);
  }
  p_Var3 = &(input->named_parameters->_M_h)._M_before_begin;
  while( true ) {
    p_Var3 = p_Var3->_M_nxt;
    if (p_Var3 == (__node_base *)0x0) {
      *(TestVectorBindData **)
       local_80._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
       super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl = local_88._M_head_impl;
      return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
             local_80._M_t.
             super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
             .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
    }
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (p_Var3 + 1),"all_flat");
    if (!bVar1) break;
    bVar1 = BooleanValue::Get((Value *)(p_Var3 + 5));
    pTVar2 = unique_ptr<duckdb::TestVectorBindData,_std::default_delete<duckdb::TestVectorBindData>,_true>
             ::operator->((unique_ptr<duckdb::TestVectorBindData,_std::default_delete<duckdb::TestVectorBindData>,_true>
                           *)&local_88);
    pTVar2->all_flat = bVar1;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&name,"Unrecognized named parameter for test_vector_types",
             (allocator *)&local_50);
  InternalException::InternalException(this_00,(string *)&name);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static unique_ptr<FunctionData> TestVectorTypesBind(ClientContext &context, TableFunctionBindInput &input,
                                                    vector<LogicalType> &return_types, vector<string> &names) {
	auto result = make_uniq<TestVectorBindData>();
	for (idx_t i = 0; i < input.inputs.size(); i++) {
		string name = "test_vector";
		if (i > 0) {
			name += to_string(i + 1);
		}
		auto &input_val = input.inputs[i];
		names.emplace_back(name);
		return_types.push_back(input_val.type());
		result->types.push_back(input_val.type());
	}
	for (auto &entry : input.named_parameters) {
		if (entry.first == "all_flat") {
			result->all_flat = BooleanValue::Get(entry.second);
		} else {
			throw InternalException("Unrecognized named parameter for test_vector_types");
		}
	}
	return std::move(result);
}